

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackOverflowCase::VertexFeedbackOverflowCase
          (VertexFeedbackOverflowCase *this,Context *context,char *name,char *description,
          Method method)

{
  Method method_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  VertexFeedbackOverflowCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexFeedbackOverflowCase_011be870;
  this->m_method = method;
  this->m_elementBuf = 0;
  this->m_arrayBuf = 0;
  this->m_feedbackBuf = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_vao = (VertexArray *)0x0;
  return;
}

Assistant:

VertexFeedbackOverflowCase::VertexFeedbackOverflowCase (Context& context, const char* name, const char* description, Method method)
	: TestCase		(context, name, description)
	, m_method		(method)
	, m_elementBuf	(0)
	, m_arrayBuf	(0)
	, m_feedbackBuf	(0)
	, m_program		(DE_NULL)
	, m_vao			(DE_NULL)
{
}